

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  Pgno PVar7;
  int iVar8;
  MemPage *pMVar9;
  ushort uVar10;
  u16 uVar11;
  int iVar12;
  uint uVar13;
  u32 uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  char *zFormat;
  ushort *puVar18;
  ulong uVar19;
  u32 *aHeap;
  uint uVar20;
  BtShared *pBVar21;
  u8 *puVar22;
  uint uVar23;
  char *pcVar24;
  u8 *puVar25;
  ulong uVar26;
  int local_f8;
  i64 maxKey_local;
  char *local_e0;
  MemPage *local_d8;
  u8 *local_d0;
  BtShared *local_c8;
  ulong local_c0;
  ulong local_b8;
  MemPage *pPage;
  int local_a4;
  uint local_a0;
  uint local_9c;
  u8 *local_98;
  ulong local_90;
  long local_88;
  u8 *local_80;
  CellInfo info;
  
  pPage = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBVar21 = pCheck->pBt;
  pcVar24 = pCheck->zPfx;
  PVar7 = pCheck->v1;
  iVar8 = pCheck->v2;
  uVar13 = pBVar21->usableSize;
  maxKey_local = maxKey;
  iVar12 = checkRef(pCheck,iPage);
  if (iVar12 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %u: ";
  pCheck->v1 = iPage;
  local_b8 = (ulong)uVar13;
  uVar13 = btreeGetPage(pBVar21,iPage,&pPage,0);
  pMVar9 = pPage;
  local_f8 = -1;
  if (uVar13 == 0) {
    uVar1 = pPage->isInit;
    pPage->isInit = '\0';
    local_c8 = pBVar21;
    uVar13 = btreeInitPage(pPage);
    if (uVar13 == 0) {
      uVar13 = btreeComputeFreeSpace(pMVar9);
      if (uVar13 == 0) {
        local_d0 = pMVar9->aData;
        bVar2 = pMVar9->hdrOffset;
        uVar15 = (ulong)bVar2;
        pCheck->zPfx = "On tree page %u cell %d: ";
        local_98 = local_d0 + uVar15;
        local_c0 = (ulong)(((uint)local_d0[uVar15 + 5] * 0x100 + (uint)local_d0[uVar15 + 6]) - 1 &
                          0xffff);
        local_88 = (ulong)local_d0[uVar15 + 3] << 8;
        bVar3 = local_d0[uVar15 + 4];
        local_90 = (ulong)bVar3;
        iVar12 = (int)local_88;
        local_d8 = pMVar9;
        bVar4 = pMVar9->leaf;
        bVar6 = true;
        local_e0 = pcVar24;
        if (bVar4 == 0) {
          uVar14 = sqlite3Get4byte(local_98 + 8);
          if (local_c8->autoVacuum != '\0') {
            pCheck->zPfx = "On page %u at right child: ";
            checkPtrmap(pCheck,uVar14,'\x05',iPage);
          }
          local_f8 = checkTreePage(pCheck,uVar14,&maxKey_local,maxKey);
          aHeap = (u32 *)0x0;
          bVar5 = false;
        }
        else {
          aHeap = pCheck->heap;
          *aHeap = 0;
          local_f8 = -1;
          bVar5 = bVar6;
        }
        local_9c = (int)local_c0 + 1;
        iVar16 = (int)local_88 + -1 + (int)local_90;
        puVar18 = (ushort *)
                  (local_d0 +
                  (long)(int)((uint)bVar2 + (uint)bVar4 * -4 + ((uint)bVar3 + iVar12) * 2 + -2) +
                  0xc);
        uVar13 = (int)local_b8 - 4;
        local_a4 = (int)local_b8 + -5;
        while ((puVar22 = local_d0, pMVar9 = local_d8, -1 < iVar16 && (pCheck->mxErr != 0))) {
          pCheck->v2 = iVar16;
          uVar10 = *puVar18 << 8 | *puVar18 >> 8;
          uVar23 = (uint)uVar10;
          if (uVar13 < uVar23 || uVar10 <= (uint)local_c0) {
            bVar6 = false;
            checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar10,(ulong)local_9c,
                           (ulong)uVar13);
          }
          else {
            local_80 = local_d0 + uVar23;
            (*local_d8->xParseCell)(local_d8,local_80,&info);
            pBVar21 = local_c8;
            if ((uint)local_b8 < info.nSize + uVar23) {
              bVar6 = false;
              checkAppendMsg(pCheck,"Extends off end of page");
            }
            else {
              if (pMVar9->intKey != '\0') {
                if (bVar5) {
                  if (maxKey_local < info.nKey) {
LAB_00179022:
                    checkAppendMsg(pCheck,"Rowid %lld out of order");
                  }
                }
                else if (maxKey_local <= info.nKey) goto LAB_00179022;
                bVar5 = false;
                maxKey_local = info.nKey;
              }
              if (info.nLocal < info.nPayload) {
                local_a0 = ((info.nPayload + local_a4) - (uint)info.nLocal) / uVar13;
                uVar14 = sqlite3Get4byte(local_80 + ((ulong)info.nSize - 4));
                if (pBVar21->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar14,'\x03',iPage);
                  pBVar21 = local_c8;
                }
                checkList(pCheck,0,uVar14,local_a0);
              }
              if (local_d8->leaf == '\0') {
                uVar14 = sqlite3Get4byte(local_80);
                if (pBVar21->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar14,'\x05',iPage);
                }
                iVar12 = checkTreePage(pCheck,uVar14,&maxKey_local,maxKey_local);
                if (iVar12 == local_f8) {
                  bVar5 = false;
                }
                else {
                  bVar5 = false;
                  checkAppendMsg(pCheck,"Child page depth differs");
                  local_f8 = iVar12;
                }
              }
              else {
                btreeHeapInsert(aHeap,((uint)uVar10 + (uint)info.nSize) - 1 | uVar23 << 0x10);
              }
            }
          }
          iVar16 = iVar16 + -1;
          puVar18 = puVar18 + -1;
        }
        *piMinKey = maxKey_local;
        pCheck->zPfx = (char *)0x0;
        pcVar24 = local_e0;
        if (bVar6) {
          if (0 < pCheck->mxErr) {
            if (local_d8->leaf == '\0') {
              aHeap = pCheck->heap;
              *aHeap = 0;
              for (uVar26 = (ulong)((uint)local_88 | (uint)local_90); 0 < (long)uVar26;
                  uVar26 = uVar26 - 1) {
                uVar10 = *(ushort *)(puVar22 + uVar26 * 2 + uVar15 + (ulong)bVar4 * -4 + 10) << 8 |
                         *(ushort *)(puVar22 + uVar26 * 2 + uVar15 + (ulong)bVar4 * -4 + 10) >> 8;
                uVar11 = (*local_d8->xCellSize)(local_d8,local_d0 + uVar10);
                btreeHeapInsert(aHeap,((uint)uVar11 + (uint)uVar10) - 1 | (uint)uVar10 << 0x10);
              }
            }
            puVar22 = local_98 + 1;
            puVar25 = local_98 + 2;
            while( true ) {
              uVar10 = CONCAT11(*puVar22,*puVar25);
              uVar15 = (ulong)uVar10;
              if (uVar15 == 0) break;
              puVar22 = local_d0 + uVar15;
              puVar25 = local_d0 + uVar15 + 1;
              btreeHeapInsert(aHeap,((uint)uVar10 +
                                    (uint)(ushort)(*(ushort *)(local_d0 + uVar15 + 2) << 8 |
                                                  *(ushort *)(local_d0 + uVar15 + 2) >> 8)) - 1 |
                                    (uint)uVar10 << 0x10);
            }
            uVar13 = *aHeap;
            iVar12 = 0;
            uVar15 = local_c0;
            while (uVar13 != 0) {
              uVar23 = aHeap[1];
              aHeap[1] = aHeap[uVar13];
              aHeap[uVar13] = 0xffffffff;
              uVar13 = uVar13 - 1;
              *aHeap = uVar13;
              uVar26 = 1;
              while (uVar17 = (int)uVar26 * 2, uVar17 <= uVar13) {
                uVar19 = (ulong)(uVar17 | 1);
                if (aHeap[uVar17] <= aHeap[uVar19]) {
                  uVar19 = (ulong)uVar17;
                }
                uVar17 = aHeap[uVar26];
                if (uVar17 < aHeap[uVar19]) break;
                aHeap[uVar26] = aHeap[uVar19];
                aHeap[uVar19] = uVar17;
                uVar26 = uVar19;
                uVar13 = *aHeap;
              }
              uVar20 = (uint)uVar15 & 0xffff;
              uVar17 = uVar23 >> 0x10;
              if (uVar17 <= uVar20) {
                checkAppendMsg(pCheck,"Multiple uses for byte %u of page %u",(ulong)uVar17,iPage);
                pcVar24 = local_e0;
                if (*aHeap != 0) goto LAB_00178db8;
                break;
              }
              iVar12 = iVar12 + uVar17 + ~uVar20;
              uVar15 = (ulong)uVar23;
            }
            uVar13 = (int)local_b8 + ~((uint)uVar15 & 0xffff) + iVar12;
            pcVar24 = local_e0;
            if (uVar13 != local_98[7]) {
              checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %u",
                             (ulong)uVar13,(ulong)local_98[7],iPage);
              pcVar24 = local_e0;
            }
          }
        }
        else {
          local_d8->isInit = uVar1;
        }
        goto LAB_00178db8;
      }
      zFormat = "free space corruption";
    }
    else {
      zFormat = "btreeInitPage() returns error code %d";
    }
  }
  else {
    zFormat = "unable to get the page. error code=%d";
  }
  checkAppendMsg(pCheck,zFormat,(ulong)uVar13);
LAB_00178db8:
  releasePage(pPage);
  pCheck->zPfx = pcVar24;
  pCheck->v1 = PVar7;
  pCheck->v2 = iVar8;
  return local_f8 + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %u cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %u at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}